

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::SGDOptimizer::MergePartialFromCodedStream
          (SGDOptimizer *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  int length;
  uint32 uVar5;
  uint uVar6;
  int iVar7;
  DoubleParameter *this_00;
  Int64Parameter *this_01;
  pair<int,_int> pVar8;
  char cVar9;
  ulong uVar10;
  
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_004b1240;
      input->buffer_ = pbVar2 + 1;
      uVar10 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_004b1240:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar10 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar5 | uVar10;
    }
    uVar5 = (uint32)uVar10;
    if ((uVar10 & 0x100000000) == 0) {
LAB_004b1261:
      if (uVar5 == 0) {
        return true;
      }
      if ((uVar5 & 7) == 4) {
        return true;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
    }
    else {
      uVar6 = (uint)(uVar10 >> 3) & 0x1fffffff;
      cVar9 = (char)uVar10;
      if (uVar6 != 3) {
        if (uVar6 == 2) {
          if (cVar9 == '\x12') {
            this_01 = this->minibatchsize_;
            if (this_01 == (Int64Parameter *)0x0) {
              this_01 = (Int64Parameter *)operator_new(0x28);
              Int64Parameter::Int64Parameter(this_01);
              this->minibatchsize_ = this_01;
            }
            puVar3 = input->buffer_;
            if ((puVar3 < input->buffer_end_) && (iVar7 = (int)(char)*puVar3, -1 < iVar7)) {
              input->buffer_ = puVar3 + 1;
            }
            else {
              iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
              if (iVar7 < 0) {
                return false;
              }
            }
            pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                              (input,iVar7);
            if ((long)pVar8 < 0) {
              return false;
            }
            bVar4 = Int64Parameter::MergePartialFromCodedStream(this_01,input);
            goto LAB_004b13a4;
          }
        }
        else if ((uVar6 == 1) && (cVar9 == '\n')) {
          this_00 = this->learningrate_;
          if (this_00 == (DoubleParameter *)0x0) {
            this_00 = (DoubleParameter *)operator_new(0x28);
            DoubleParameter::DoubleParameter(this_00);
            this->learningrate_ = this_00;
          }
          goto LAB_004b1338;
        }
        goto LAB_004b1261;
      }
      if (cVar9 != '\x1a') goto LAB_004b1261;
      this_00 = this->momentum_;
      if (this_00 == (DoubleParameter *)0x0) {
        this_00 = (DoubleParameter *)operator_new(0x28);
        DoubleParameter::DoubleParameter(this_00);
        this->momentum_ = this_00;
      }
LAB_004b1338:
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (iVar7 = (int)(char)*puVar3, -1 < iVar7)) {
        input->buffer_ = puVar3 + 1;
      }
      else {
        iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar7 < 0) {
          return false;
        }
      }
      pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar7);
      if ((long)pVar8 < 0) {
        return false;
      }
      bVar4 = DoubleParameter::MergePartialFromCodedStream(this_00,input);
LAB_004b13a4:
      if (bVar4 == false) {
        return false;
      }
      bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar8.first);
    }
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool SGDOptimizer::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.SGDOptimizer)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.DoubleParameter learningRate = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_learningrate()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Parameter miniBatchSize = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_minibatchsize()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.DoubleParameter momentum = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_momentum()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.SGDOptimizer)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.SGDOptimizer)
  return false;
#undef DO_
}